

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ch.cpp
# Opt level: O0

HRESULT GetParserStateBuffer
                  (LPCSTR fileContents,JsFinalizeCallback fileContentsFinalizeCallback,
                  JsValueRef *parserStateBuffer)

{
  JsErrorCode JVar1;
  size_t sVar2;
  PAL_FILE *pPVar3;
  LPCWSTR pWVar4;
  JsErrorCode jsErrorCode_1;
  JsErrorCode jsErrorCode;
  JsValueRef scriptSource;
  JsValueRef *ppvStack_20;
  HRESULT hr;
  JsValueRef *parserStateBuffer_local;
  JsFinalizeCallback fileContentsFinalizeCallback_local;
  LPCSTR fileContents_local;
  
  scriptSource._4_4_ = 0;
  _jsErrorCode_1 = (JsValueRef)0x0;
  ppvStack_20 = parserStateBuffer;
  parserStateBuffer_local = (JsValueRef *)fileContentsFinalizeCallback;
  fileContentsFinalizeCallback_local = (JsFinalizeCallback)fileContents;
  sVar2 = strlen(fileContents);
  JVar1 = ChakraRTInterface::JsCreateExternalArrayBuffer
                    (fileContents,(uint)sVar2,(JsFinalizeCallback)parserStateBuffer_local,
                     fileContentsFinalizeCallback_local,(JsValueRef *)&jsErrorCode_1);
  if (JVar1 == JsNoError) {
    JVar1 = ChakraRTInterface::JsSerializeParserState
                      (_jsErrorCode_1,ppvStack_20,JsParseScriptAttributeNone);
    if (JVar1 != JsNoError) {
      pPVar3 = PAL_get_stderr(0);
      pWVar4 = Helpers::JsErrorCodeToString(JVar1);
      PAL_fwprintf(pPVar3,
                   L"ERROR: ChakraRTInterface::JsSerializeParserState(scriptSource, parserStateBuffer, JsParseScriptAttributeNone) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar1,pWVar4);
      pPVar3 = PAL_get_stderr(0);
      PAL_fflush(pPVar3);
    }
  }
  else {
    pPVar3 = PAL_get_stderr(0);
    pWVar4 = Helpers::JsErrorCodeToString(JVar1);
    PAL_fwprintf(pPVar3,
                 L"ERROR: ChakraRTInterface::JsCreateExternalArrayBuffer((void*)fileContents, (unsigned int)strlen(fileContents), fileContentsFinalizeCallback, (void*)fileContents, &scriptSource) failed. JsErrorCode=0x%x (%s)\n"
                 ,(ulong)JVar1,pWVar4);
    pPVar3 = PAL_get_stderr(0);
    PAL_fflush(pPVar3);
  }
  return scriptSource._4_4_;
}

Assistant:

HRESULT GetParserStateBuffer(LPCSTR fileContents, JsFinalizeCallback fileContentsFinalizeCallback, JsValueRef *parserStateBuffer)
{
    HRESULT hr = S_OK;
    JsValueRef scriptSource = nullptr;

    IfJsErrorFailLog(ChakraRTInterface::JsCreateExternalArrayBuffer((void*)fileContents,
        (unsigned int)strlen(fileContents), fileContentsFinalizeCallback, (void*)fileContents, &scriptSource));

    IfJsErrorFailLog(ChakraRTInterface::JsSerializeParserState(scriptSource, parserStateBuffer, JsParseScriptAttributeNone));

Error:
    return hr;
}